

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::EnumDescriptorProto::_InternalSerialize
          (EnumDescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  string *psVar2;
  EnumOptions *this_00;
  size_t __n;
  void *pvVar3;
  bool bVar4;
  uint uVar5;
  Type *this_01;
  Type *this_02;
  Type *s;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint8 *puVar9;
  uint8 *puVar10;
  
  uVar5 = (this->_has_bits_).has_bits_[0];
  if ((uVar5 & 1) != 0) {
    psVar2 = (this->name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.EnumDescriptorProto.name");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,(this->name_).ptr_,target);
  }
  iVar1 = (this->value_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar8 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_01 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                          (&(this->value_).super_RepeatedPtrFieldBase,iVar8);
      *target = '\x12';
      uVar7 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar7 < 0x80) {
        target[1] = (byte)uVar7;
        puVar9 = target + 2;
      }
      else {
        target[1] = (byte)uVar7 | 0x80;
        if (uVar7 < 0x4000) {
          target[2] = (uint8)(uVar7 >> 7);
          puVar9 = target + 3;
        }
        else {
          puVar9 = target + 3;
          uVar7 = uVar7 >> 7;
          do {
            puVar10 = puVar9;
            puVar10[-1] = (byte)uVar7 | 0x80;
            uVar6 = uVar7 >> 7;
            puVar9 = puVar10 + 1;
            bVar4 = 0x3fff < uVar7;
            uVar7 = uVar6;
          } while (bVar4);
          *puVar10 = (uint8)uVar6;
        }
      }
      target = EnumValueDescriptorProto::_InternalSerialize(this_01,puVar9,stream);
      iVar8 = iVar8 + 1;
    } while (iVar8 != iVar1);
  }
  if ((uVar5 & 2) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = this->options_;
    *target = '\x1a';
    uVar5 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    if (uVar5 < 0x80) {
      target[1] = (byte)uVar5;
      puVar9 = target + 2;
    }
    else {
      target[1] = (byte)uVar5 | 0x80;
      if (uVar5 < 0x4000) {
        target[2] = (uint8)(uVar5 >> 7);
        puVar9 = target + 3;
      }
      else {
        puVar9 = target + 3;
        uVar5 = uVar5 >> 7;
        do {
          puVar10 = puVar9;
          puVar10[-1] = (byte)uVar5 | 0x80;
          uVar7 = uVar5 >> 7;
          puVar9 = puVar10 + 1;
          bVar4 = 0x3fff < uVar5;
          uVar5 = uVar7;
        } while (bVar4);
        *puVar10 = (uint8)uVar7;
      }
    }
    target = EnumOptions::_InternalSerialize(this_00,puVar9,stream);
  }
  iVar1 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar8 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_02 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>::TypeHandler>
                          (&(this->reserved_range_).super_RepeatedPtrFieldBase,iVar8);
      *target = '\"';
      uVar5 = (this_02->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar5 < 0x80) {
        target[1] = (byte)uVar5;
        puVar9 = target + 2;
      }
      else {
        target[1] = (byte)uVar5 | 0x80;
        if (uVar5 < 0x4000) {
          target[2] = (uint8)(uVar5 >> 7);
          puVar9 = target + 3;
        }
        else {
          puVar9 = target + 3;
          uVar5 = uVar5 >> 7;
          do {
            puVar10 = puVar9;
            puVar10[-1] = (byte)uVar5 | 0x80;
            uVar7 = uVar5 >> 7;
            puVar9 = puVar10 + 1;
            bVar4 = 0x3fff < uVar5;
            uVar5 = uVar7;
          } while (bVar4);
          *puVar10 = (uint8)uVar7;
        }
      }
      target = EnumDescriptorProto_EnumReservedRange::_InternalSerialize(this_02,puVar9,stream);
      iVar8 = iVar8 + 1;
    } while (iVar8 != iVar1);
  }
  iVar1 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar1) {
    iVar8 = 0;
    do {
      s = internal::RepeatedPtrFieldBase::
          Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                    (&(this->reserved_name_).super_RepeatedPtrFieldBase,iVar8);
      internal::WireFormatLite::VerifyUtf8String
                ((s->_M_dataplus)._M_p,(int)s->_M_string_length,SERIALIZE,
                 "google.protobuf.EnumDescriptorProto.reserved_name");
      __n = s->_M_string_length;
      if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = '*';
        target[1] = (uint8)__n;
        memcpy(target + 2,(s->_M_dataplus)._M_p,__n);
        target = target + __n + 2;
      }
      else {
        target = io::EpsCopyOutputStream::WriteStringOutline(stream,5,s,target);
      }
      iVar8 = iVar8 + 1;
    } while (iVar1 != iVar8);
  }
  pvVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar9 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 8),target,stream)
    ;
    return puVar9;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* EnumDescriptorProto::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.EnumDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.EnumDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_value_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(2, this->_internal_value(i), target, stream);
  }

  // optional .google.protobuf.EnumOptions options = 3;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        3, _Internal::options(this), target, stream);
  }

  // repeated .google.protobuf.EnumDescriptorProto.EnumReservedRange reserved_range = 4;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_reserved_range_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(4, this->_internal_reserved_range(i), target, stream);
  }

  // repeated string reserved_name = 5;
  for (int i = 0, n = this->_internal_reserved_name_size(); i < n; i++) {
    const auto& s = this->_internal_reserved_name(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.EnumDescriptorProto.reserved_name");
    target = stream->WriteString(5, s, target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.EnumDescriptorProto)
  return target;
}